

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_string_view.pb.cc
# Opt level: O2

void proto2_unittest::TestStringViewExtension::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestStringViewExtension *_this;
  TestStringViewExtension *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (TestStringViewExtension *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestStringViewExtension_const*,proto2_unittest::TestStringViewExtension*>
                          ((TestStringViewExtension **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(local_20->field_0)._impl_._extensions_,
               (MessageLite *)_TestStringViewExtension_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_string_view.pb.cc"
             ,0x2fb,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void TestStringViewExtension::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestStringViewExtension*>(&to_msg);
  auto& from = static_cast<const TestStringViewExtension&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestStringViewExtension)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}